

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O2

void Curl_freeaddrinfo(Curl_addrinfo *cahead)

{
  Curl_addrinfo *pCVar1;
  
  while (cahead != (Curl_addrinfo *)0x0) {
    if (cahead->ai_addr != (sockaddr *)0x0) {
      (*Curl_cfree)(cahead->ai_addr);
    }
    if (cahead->ai_canonname != (char *)0x0) {
      (*Curl_cfree)(cahead->ai_canonname);
    }
    pCVar1 = cahead->ai_next;
    (*Curl_cfree)(cahead);
    cahead = pCVar1;
  }
  return;
}

Assistant:

void
Curl_freeaddrinfo(Curl_addrinfo *cahead)
{
  Curl_addrinfo *vqualifier canext;
  Curl_addrinfo *ca;

  for(ca = cahead; ca != NULL; ca = canext) {

    if(ca->ai_addr)
      free(ca->ai_addr);

    if(ca->ai_canonname)
      free(ca->ai_canonname);

    canext = ca->ai_next;

    free(ca);
  }
}